

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest> *this,
          void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  
  if (pointer != (void *)0x0) {
    *(undefined ***)((long)pointer + 0x38) = &PTR_extractCap_0061e0c8;
    lVar1 = *(long *)((long)pointer + 0x40);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x48);
      lVar3 = *(long *)((long)pointer + 0x50);
      *(undefined8 *)((long)pointer + 0x40) = 0;
      *(undefined8 *)((long)pointer + 0x48) = 0;
      *(undefined8 *)((long)pointer + 0x50) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x58))
                (*(undefined8 **)((long)pointer + 0x58),lVar1,0x10,lVar2 - lVar1 >> 4,
                 lVar3 - lVar1 >> 4,
                 ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
    }
    plVar4 = *(long **)((long)pointer + 0x30);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x28))
                (*(undefined8 **)((long)pointer + 0x28),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    plVar4 = *(long **)((long)pointer + 0x20);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    plVar4 = *(long **)((long)pointer + 0x10);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
  }
  operator_delete(pointer,0xa0);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }